

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_node.hpp
# Opt level: O2

bool jsoncons::jsonpath::operator<(basic_path_node<wchar_t> *lhs,basic_path_node<wchar_t> *rhs)

{
  path_node_kind pVar1;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __str;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = lhs->size_;
  uVar5 = rhs->size_;
  uVar3 = uVar6;
  if (uVar5 < uVar6) {
    uVar3 = uVar5;
  }
  while (uVar3 < uVar6) {
    lhs = lhs->parent_;
    uVar6 = lhs->size_;
  }
  bVar4 = false;
  while (uVar3 < uVar5) {
    rhs = rhs->parent_;
    bVar4 = true;
    uVar5 = rhs->size_;
  }
  do {
    if (lhs == (basic_path_node<wchar_t> *)0x0) {
      return bVar4;
    }
    pVar1 = lhs->node_kind_;
    iVar2 = pVar1 - rhs->node_kind_;
    if (iVar2 == 0) {
      if (pVar1 < index) {
        __str._M_len = (rhs->name_)._M_len;
        __str._M_str = (rhs->name_)._M_str;
        iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                          (&lhs->name_,__str);
        goto LAB_0035b489;
      }
      if (pVar1 == index) {
        iVar2 = (int)lhs->index_ - (int)rhs->index_;
        goto LAB_0035b489;
      }
    }
    else {
LAB_0035b489:
      bVar4 = (bool)(iVar2 == 0 & bVar4 | iVar2 < 0);
    }
    lhs = lhs->parent_;
    rhs = rhs->parent_;
  } while( true );
}

Assistant:

bool operator<(const basic_path_node& lhs, const basic_path_node& rhs)
        {
            std::size_t len = (std::min)(lhs.size(),rhs.size());

            const basic_path_node* p_lhs = std::addressof(lhs);
            const basic_path_node* p_rhs = std::addressof(rhs);

            bool is_less = false;
            while (p_lhs->size() > len)
            {
                p_lhs = p_lhs->parent_;
                is_less = false;
            }
            while (p_rhs->size() > len)
            {
                p_rhs = p_rhs->parent_;
                is_less = true;
            }
            while (p_lhs != nullptr)
            {
                int diff = 0;
                if (p_lhs->node_kind_ != p_rhs->node_kind_)
                {
                    diff = static_cast<int>(p_lhs->node_kind_) - static_cast<int>(p_rhs->node_kind_);
                }
                else
                {
                    switch (p_lhs->node_kind_)
                    {
                        case path_node_kind::root:
                        case path_node_kind::name:
                            diff = p_lhs->name_.compare(p_rhs->name_);
                            break;
                        case path_node_kind::index:
                            diff = static_cast<int>(p_lhs->index_) - static_cast<int>(p_rhs->index_);
                            break;
                        default:
                            break;
                    }
                }
                if (diff < 0)
                {
                    is_less = true;
                }
                else if (diff > 0)
                {
                    is_less = false;
                }

                p_lhs = p_lhs->parent_;
                p_rhs = p_rhs->parent_;
            }

            return is_less;
        }